

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesRasGetState(zes_ras_handle_t hRas,ze_bool_t clear,zes_ras_state_t *pState)

{
  zes_pfnRasGetState_t pfnGetState;
  dditable_t *dditable;
  ze_result_t result;
  zes_ras_state_t *pState_local;
  ze_bool_t clear_local;
  zes_ras_handle_t hRas_local;
  
  if (*(code **)(*(long *)(hRas + 8) + 0xcb0) == (code *)0x0) {
    hRas_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hRas_local._4_4_ =
         (**(code **)(*(long *)(hRas + 8) + 0xcb0))(*(undefined8 *)hRas,clear,pState,clear);
  }
  return hRas_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasGetState(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        ze_bool_t clear,                                ///< [in] Set to 1 to clear the counters of this type
        zes_ras_state_t* pState                         ///< [in,out] Breakdown of where errors have occurred
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_ras_object_t*>( hRas )->dditable;
        auto pfnGetState = dditable->zes.Ras.pfnGetState;
        if( nullptr == pfnGetState )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hRas = reinterpret_cast<zes_ras_object_t*>( hRas )->handle;

        // forward to device-driver
        result = pfnGetState( hRas, clear, pState );

        return result;
    }